

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interval.cpp
# Opt level: O3

int __thiscall regex::Interval::CompareTo(Interval *this,Interval other)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if ((other.begin <= this->begin) && (uVar1 = 1, this->begin == other.begin)) {
    uVar1 = 0xffffffff;
    if (other.end <= this->end) {
      uVar1 = (uint)(this->end != other.end);
    }
  }
  return uVar1;
}

Assistant:

int Interval::CompareTo(Interval other)
    {
        if (begin < other.begin)
        {
            return -1;
        }
        else if (begin == other.begin)
        {
            if (end < other.end)
            {
                return -1;
            }
            else if (end == other.end)
            {
                return 0;
            }
            else
            {
                return 1;
            }
        }
        else
        {
            return 1;
        }
    }